

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_MessageDestroy(hrgls_Message obj)

{
  if (obj != (hrgls_Message)0x0) {
    std::__cxx11::string::~string((string *)obj);
    operator_delete(obj);
    return 0;
  }
  return 0x3ec;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageDestroy(hrgls_Message obj)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_DELETE_OF_NULL_POINTER;
	  }
	  try {
		  delete obj;
	  } catch (...) {
		  s = hrgls_STATUS_DELETION_FAILED;
	  }
	  return s;
  }